

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data.cc
# Opt level: O0

bool __thiscall
bssl::VerifySignedData
          (bssl *this,SignatureAlgorithm algorithm,Input signed_data,BitString *signature_value,
          EVP_PKEY *public_key,SignatureVerifyCache *cache)

{
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  EVP_MD_CTX *ctx_00;
  env_md_ctx_st *ctx_01;
  uint8_t *sig;
  size_t sig_len;
  uint8_t *data;
  size_t len;
  undefined4 in_register_00000034;
  bool bVar4;
  string_view algorithm_name;
  Input signed_data_00;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  EVP_PKEY_CTX *pEStack_1d8;
  bool ret;
  EVP_PKEY_CTX *pctx;
  ScopedEVP_MD_CTX ctx;
  OpenSSLErrStackTracer err_tracer;
  string local_168;
  string local_148 [8];
  string cache_key;
  Input signature_value_bytes;
  size_t local_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 auStack_68 [8];
  string_view cache_algorithm_name;
  EVP_MD *pEStack_50;
  bool is_rsa_pss;
  EVP_MD *digest;
  int expected_pkey_id;
  SignatureVerifyCache *cache_local;
  EVP_PKEY *public_key_local;
  BitString *signature_value_local;
  undefined1 auStack_20 [4];
  SignatureAlgorithm algorithm_local;
  Input signed_data_local;
  
  _auStack_20 = (uchar *)CONCAT44(in_register_00000034,algorithm);
  signed_data_local.data_.data_ = signed_data.data_.data_;
  digest._4_4_ = 1;
  pEStack_50 = (EVP_MD *)0x0;
  cache_algorithm_name._M_str._7_1_ = 0;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
  switch((ulong)this & 0xffffffff) {
  case 0:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha1();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"RsaPkcs1Sha1");
    auStack_68 = (undefined1  [8])local_78._M_len;
    cache_algorithm_name._M_len = (size_t)local_78._M_str;
    break;
  case 1:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha256();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,"RsaPkcs1Sha256");
    auStack_68 = (undefined1  [8])local_88._M_len;
    cache_algorithm_name._M_len = (size_t)local_88._M_str;
    break;
  case 2:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha384();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"RsaPkcs1Sha384");
    auStack_68 = (undefined1  [8])local_98._M_len;
    cache_algorithm_name._M_len = (size_t)local_98._M_str;
    break;
  case 3:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha512();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a8,"RsaPkcs1Sha512");
    auStack_68 = (undefined1  [8])local_a8._M_len;
    cache_algorithm_name._M_len = (size_t)local_a8._M_str;
    break;
  case 4:
    digest._4_4_ = 0x198;
    pEStack_50 = EVP_sha1();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,"EcdsaSha1");
    auStack_68 = (undefined1  [8])local_b8._M_len;
    cache_algorithm_name._M_len = (size_t)local_b8._M_str;
    break;
  case 5:
    digest._4_4_ = 0x198;
    pEStack_50 = EVP_sha256();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_c8,"EcdsaSha256");
    auStack_68 = (undefined1  [8])local_c8._M_len;
    cache_algorithm_name._M_len = (size_t)local_c8._M_str;
    break;
  case 6:
    digest._4_4_ = 0x198;
    pEStack_50 = EVP_sha384();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,"EcdsaSha384");
    auStack_68 = (undefined1  [8])local_d8._M_len;
    cache_algorithm_name._M_len = (size_t)local_d8._M_str;
    break;
  case 7:
    digest._4_4_ = 0x198;
    pEStack_50 = EVP_sha512();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"EcdsaSha512");
    auStack_68 = (undefined1  [8])local_e8._M_len;
    cache_algorithm_name._M_len = (size_t)local_e8._M_str;
    break;
  case 8:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha256();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f8,"RsaPssSha256");
    auStack_68 = (undefined1  [8])local_f8._M_len;
    cache_algorithm_name._M_len = (size_t)local_f8._M_str;
    cache_algorithm_name._M_str._7_1_ = 1;
    break;
  case 9:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha384();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_108,"RsaPssSha384");
    auStack_68 = (undefined1  [8])local_108._M_len;
    cache_algorithm_name._M_len = (size_t)local_108._M_str;
    cache_algorithm_name._M_str._7_1_ = 1;
    break;
  case 10:
    digest._4_4_ = 6;
    pEStack_50 = EVP_sha512();
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &signature_value_bytes.data_.size_,"RsaPssSha512");
    auStack_68 = (undefined1  [8])signature_value_bytes.data_.size_;
    cache_algorithm_name._M_len = local_110;
    cache_algorithm_name._M_str._7_1_ = 1;
  }
  iVar2 = EVP_PKEY_id((EVP_PKEY *)signature_value);
  if (digest._4_4_ != iVar2) {
    signed_data_local.data_.size_._7_1_ = 0;
    goto LAB_00620072;
  }
  uVar1 = der::BitString::unused_bits((BitString *)signed_data.data_.size_);
  if (uVar1 != '\0') {
    signed_data_local.data_.size_._7_1_ = 0;
    goto LAB_00620072;
  }
  join_0x00000010_0x00000000_ =
       (Span<const_unsigned_char>)der::BitString::bytes((BitString *)signed_data.data_.size_);
  ::std::__cxx11::string::string(local_148);
  if (public_key == (EVP_PKEY *)0x0) {
LAB_0061fe28:
    internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)&pctx);
    pEStack_1d8 = (EVP_PKEY_CTX *)0x0;
    ctx_00 = (EVP_MD_CTX *)
             internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)&pctx);
    iVar2 = EVP_DigestVerifyInit
                      (ctx_00,(EVP_PKEY_CTX **)&stack0xfffffffffffffe28,pEStack_50,(ENGINE *)0x0,
                       (EVP_PKEY *)signature_value);
    if (iVar2 == 0) {
      signed_data_local.data_.size_._7_1_ = false;
    }
    else if (((cache_algorithm_name._M_str._7_1_ & 1) == 0) ||
            ((iVar2 = EVP_PKEY_CTX_set_rsa_padding(pEStack_1d8,6), iVar2 != 0 &&
             (iVar2 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pEStack_1d8,-1), iVar2 != 0)))) {
      ctx_01 = internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)&pctx);
      sig = der::Input::data((Input *)((long)&cache_key.field_2 + 8));
      sig_len = der::Input::size((Input *)((long)&cache_key.field_2 + 8));
      data = der::Input::data((Input *)auStack_20);
      len = der::Input::size((Input *)auStack_20);
      iVar2 = EVP_DigestVerify(ctx_01,sig,sig_len,data,len);
      bVar4 = iVar2 == 1;
      uVar3 = ::std::__cxx11::string::empty();
      signed_data_local.data_.size_._7_1_ = bVar4;
      if ((uVar3 & 1) == 0) {
        (**(code **)(*(long *)public_key + 0x10))(public_key,local_148,~bVar4 & 1);
      }
    }
    else {
      signed_data_local.data_.size_._7_1_ = false;
    }
    internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)&pctx);
    anon_unknown_0::OpenSSLErrStackTracer::~OpenSSLErrStackTracer
              ((OpenSSLErrStackTracer *)((long)&ctx.ctx_.pctx_ops + 7));
  }
  else {
    algorithm_name._M_str = (char *)_auStack_20;
    algorithm_name._M_len = cache_algorithm_name._M_len;
    signed_data_00.data_.size_ = (size_t)signature_value;
    signed_data_00.data_.data_ = signed_data_local.data_.data_;
    (anonymous_namespace)::SignatureVerifyCacheKey_abi_cxx11_
              (&local_168,(_anonymous_namespace_ *)auStack_68,algorithm_name,signed_data_00,
               (Input)stack0xfffffffffffffed8,
               (EVP_PKEY *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    ::std::__cxx11::string::operator=(local_148,(string *)&local_168);
    ::std::__cxx11::string::~string((string *)&local_168);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) goto LAB_0061fe28;
    iVar2 = (**(code **)(*(long *)public_key + 0x18))(public_key,local_148);
    if (iVar2 == 0) {
      signed_data_local.data_.size_._7_1_ = 1;
    }
    else {
      if (iVar2 != 1) goto LAB_0061fe28;
      signed_data_local.data_.size_._7_1_ = 0;
    }
  }
  ::std::__cxx11::string::~string(local_148);
LAB_00620072:
  return (bool)(signed_data_local.data_.size_._7_1_ & 1);
}

Assistant:

bool VerifySignedData(SignatureAlgorithm algorithm, der::Input signed_data,
                      const der::BitString &signature_value,
                      EVP_PKEY *public_key, SignatureVerifyCache *cache) {
  int expected_pkey_id = 1;
  const EVP_MD *digest = nullptr;
  bool is_rsa_pss = false;
  std::string_view cache_algorithm_name;
  switch (algorithm) {
    case SignatureAlgorithm::kRsaPkcs1Sha1:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha1();
      cache_algorithm_name = "RsaPkcs1Sha1";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPkcs1Sha256";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPkcs1Sha384";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPkcs1Sha512";
      break;

    case SignatureAlgorithm::kEcdsaSha1:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha1();
      cache_algorithm_name = "EcdsaSha1";
      break;
    case SignatureAlgorithm::kEcdsaSha256:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha256();
      cache_algorithm_name = "EcdsaSha256";
      break;
    case SignatureAlgorithm::kEcdsaSha384:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha384();
      cache_algorithm_name = "EcdsaSha384";
      break;
    case SignatureAlgorithm::kEcdsaSha512:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha512();
      cache_algorithm_name = "EcdsaSha512";
      break;

    case SignatureAlgorithm::kRsaPssSha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPssSha256";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPssSha384";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPssSha512";
      is_rsa_pss = true;
      break;
  }

  if (expected_pkey_id != EVP_PKEY_id(public_key)) {
    return false;
  }

  // For the supported algorithms the signature value must be a whole
  // number of bytes.
  if (signature_value.unused_bits() != 0) {
    return false;
  }
  der::Input signature_value_bytes = signature_value.bytes();

  std::string cache_key;
  if (cache) {
    cache_key = SignatureVerifyCacheKey(cache_algorithm_name, signed_data,
                                        signature_value_bytes, public_key);
    if (!cache_key.empty()) {
      switch (cache->Check(cache_key)) {
        case SignatureVerifyCache::Value::kValid:
          return true;
        case SignatureVerifyCache::Value::kInvalid:
          return false;
        case SignatureVerifyCache::Value::kUnknown:
          break;
      }
    }
  }

  OpenSSLErrStackTracer err_tracer;

  bssl::ScopedEVP_MD_CTX ctx;
  EVP_PKEY_CTX *pctx = nullptr;  // Owned by |ctx|.

  if (!EVP_DigestVerifyInit(ctx.get(), &pctx, digest, nullptr, public_key)) {
    return false;
  }

  if (is_rsa_pss) {
    // All supported RSASSA-PSS algorithms match signing and MGF-1 digest. They
    // also use the digest length as the salt length, which is specified with -1
    // in OpenSSL's API.
    if (!EVP_PKEY_CTX_set_rsa_padding(pctx, RSA_PKCS1_PSS_PADDING) ||
        !EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx, -1)) {
      return false;
    }
  }

  bool ret = 1 == EVP_DigestVerify(ctx.get(), signature_value_bytes.data(),
                                   signature_value_bytes.size(),
                                   signed_data.data(), signed_data.size());
  if (!cache_key.empty()) {
    cache->Store(cache_key, ret ? SignatureVerifyCache::Value::kValid
                                : SignatureVerifyCache::Value::kInvalid);
  }

  return ret;
}